

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CharacterClassPass1<false>
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  undefined1 *puVar1;
  uint32 *puVar2;
  undefined **ppuVar3;
  CharSetNode *pCVar4;
  code *pcVar5;
  Node *pNVar6;
  undefined2 uVar7;
  bool bVar8;
  utf8char_t uVar9;
  OLECHAR OVar10;
  uint uVar11;
  int iVar12;
  codepoint_t codePointValue;
  uint uVar13;
  uint uVar14;
  undefined4 *puVar15;
  EncodedCharPtr puVar16;
  ulong uVar17;
  Node *pNVar18;
  undefined4 extraout_var;
  AltNode *pAVar19;
  AltNode *pAVar20;
  Char CVar21;
  long *plVar22;
  byte bVar23;
  undefined4 uVar24;
  undefined7 uVar26;
  Parser<UTF8EncodingPolicyBase<false>,_true> *pPVar25;
  ArenaAllocator *pAVar27;
  CharSet<unsigned_int> *pCVar28;
  uint totalCount;
  int iVar29;
  uint uVar30;
  uint uVar31;
  MatchSetNode *node;
  long lVar32;
  NodeTag *pNVar33;
  EncodedCharPtr puVar34;
  AltNode *lastAltNode;
  undefined1 auVar35 [16];
  undefined1 local_930 [8];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  MatchSetNode local_3e0;
  undefined1 local_378 [8];
  CharSet<unsigned_int> codePointSet;
  CharSet<unsigned_int> *local_80;
  Char local_6c;
  uint uStack_68;
  codepoint_t upperCharOfRange;
  EncodedChar **local_60;
  CharSet<unsigned_int> *local_58;
  bool local_49;
  Parser<UTF8EncodingPolicyBase<false>,_true> *pPStack_48;
  bool previousWasASurrogate;
  undefined4 *local_40;
  utf8char_t local_31;
  
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_378);
  local_3e0.super_Node.tag = MatchSet;
  local_3e0.super_Node._10_8_ = 0;
  local_3e0.super_Node.firstSet._2_2_ = 0;
  local_3e0.super_Node._20_6_ = 0;
  local_3e0.super_Node.followSet._2_2_ = 0;
  local_3e0.super_Node._28_8_ = 0;
  local_3e0.super_Node.prevConsumes.upper = 0xffffffff;
  local_3e0.super_Node.thisConsumes.lower = 0;
  local_3e0.super_Node.thisConsumes.upper = 0xffffffff;
  local_3e0.super_Node.followConsumes.lower = 0;
  local_3e0.super_Node.followConsumes.upper = 0xffffffff;
  local_3e0.super_Node._vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
  local_3e0.isNegation = false;
  local_3e0.needsEquivClass = true;
  CharSet<char16_t>::CharSet(&local_3e0.set);
  pmovsxbd(ZEXT816(0),0xff00ff);
  codePointSet.characterPlanes[0x10].rep._32_8_ = &PTR_LiteralLength_01542a10;
  puVar16 = this->inputLim;
  puVar34 = this->next;
  if (puVar16 < puVar34) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar8) goto LAB_00edbcd5;
    *puVar15 = 0;
    puVar16 = this->inputLim;
    puVar34 = this->next;
  }
  local_60 = &this->next;
  local_31 = *puVar34;
  pPStack_48 = this;
  if (local_31 == '^') {
    if (puVar16 < puVar34 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar8) goto LAB_00edbcd5;
      *puVar15 = 0;
      puVar34 = *local_60;
      if ((char)*puVar34 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar8) goto LAB_00edbcd5;
        *puVar15 = 0;
        puVar34 = *local_60;
      }
    }
    puVar34 = puVar34 + 1;
    pPStack_48->next = puVar34;
    puVar16 = pPStack_48->inputLim;
  }
  pPVar25 = pPStack_48;
  if (puVar16 < puVar34) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar8) {
LAB_00edbcd5:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    local_40 = puVar15;
    *puVar15 = 0;
    puVar34 = *local_60;
  }
  else {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  local_80 = &codePointSet;
  uVar9 = *puVar34;
  local_49 = false;
  uVar13 = 0xffffffff;
  local_58 = (CharSet<unsigned_int> *)local_378;
  uVar24 = 0;
  uVar30 = 0xffffffff;
  uVar31 = 0;
  do {
    _uStack_68 = (Node *)CONCAT44(upperCharOfRange,uVar24);
    CVar21 = uVar30;
    if (uVar9 == '-') {
      puVar16 = pPVar25->inputLim;
      if (uVar30 != 0xffffffff && uVar13 == 0xffffffff) {
        if (puVar16 < puVar34 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = local_40;
          *local_40 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar8) goto LAB_00edbcd5;
          *puVar15 = 0;
          puVar16 = pPVar25->inputLim;
          puVar34 = pPVar25->next;
        }
        if (puVar34[1] != ']') {
          if (puVar16 < puVar34 + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = local_40;
            *local_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar8) goto LAB_00edbcd5;
            *puVar15 = 0;
            puVar34 = *local_60;
          }
          if ((char)*puVar34 < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = local_40;
            *local_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                               "!this->IsMultiUnitChar(next[i])");
            if (!bVar8) goto LAB_00edbcd5;
            *puVar15 = 0;
            puVar34 = *local_60;
          }
          *local_60 = puVar34 + 1;
          CVar21 = 0xffffffff;
          bVar23 = 0;
          uVar26 = 0;
          uVar13 = uVar30;
          goto LAB_00edab8d;
        }
      }
      if (puVar16 < puVar34 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = local_40;
        *local_40 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00edbcd5;
        *puVar15 = 0;
        puVar34 = *local_60;
      }
      if ((char)*puVar34 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = local_40;
        *local_40 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar8) goto LAB_00edbcd5;
        *puVar15 = 0;
        puVar34 = *local_60;
      }
      *local_60 = puVar34 + 1;
      uVar30 = 0x2d;
      goto LAB_00edab88;
    }
    if (uVar9 == '\\') {
      if (pPVar25->inputLim < puVar34 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = local_40;
        *local_40 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar8) goto LAB_00edbcd5;
        *puVar15 = 0;
        puVar34 = *local_60;
      }
      if ((char)*puVar34 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = local_40;
        *local_40 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar8) goto LAB_00edbcd5;
        *puVar15 = 0;
        puVar34 = *local_60;
      }
      pPVar25->next = puVar34 + 1;
      pNVar18 = ClassEscapePass1(pPVar25,(MatchCharNode *)
                                         (codePointSet.characterPlanes[0x10].rep.full.direct.vec + 6
                                         ),&local_3e0,&local_49);
      if (pNVar18->tag != MatchSet) {
        uVar30 = 0;
        goto LAB_00edab88;
      }
      if (uVar13 != 0xffffffff) {
        if (pPVar25->unicodeFlagPresent == true) {
          Fail(pPVar25,-0x7ff5e9d3);
        }
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)local_378,pPVar25->ctAllocator,0x2d,0x2d);
      }
      CharSet<unsigned_int>::UnionInPlace
                ((CharSet<unsigned_int> *)local_378,pPVar25->ctAllocator,&local_3e0.set);
      uVar26 = (undefined7)((ulong)pPVar25 >> 8);
      bVar23 = 1;
      uVar30 = 0xffffffff;
      uVar13 = 0xffffffff;
    }
    else {
      if (uVar9 == ']') {
        if (uVar30 != 0xffffffff) {
          CharSet<unsigned_int>::SetRange
                    ((CharSet<unsigned_int> *)local_378,pPVar25->ctAllocator,uVar30,uVar30);
        }
        puVar15 = local_40;
        if (pPVar25->unicodeFlagPresent != false) {
          if (((pPVar25->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x8e9,
                               "(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                               "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
            if (!bVar8) goto LAB_00edbcd5;
            *puVar15 = 0;
          }
          if (local_378 != (undefined1  [8])&DAT_00000001) goto LAB_00edaf36;
          uVar17 = 0xffffffffffffffff;
          plVar22 = (long *)((long)&codePointSet.characterPlanes[0].rep + 0x20);
          break;
        }
        if (&DAT_00000004 < (undefined1 *)((long)local_378 - 1U)) {
          if (local_378 == (undefined1  [8])0x0) {
            uVar11 = CharBitvec::Count((CharBitvec *)&codePointSet);
            _uStack_68 = (Node *)CONCAT44(extraout_var,uVar11);
          }
          else {
            if ((local_378 != (undefined1  [8])&CharSetFull::Instance) &&
               (uVar31 = (*(*(_func_int ***)local_378)[0xb])(local_378,2), 0xff00 < uVar31)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar8) goto LAB_00edbcd5;
              *puVar15 = 0;
            }
            uVar11 = CharBitvec::Count((CharBitvec *)&codePointSet);
            if (local_378 == (undefined1  [8])&CharSetFull::Instance) {
              iVar29 = 0xff00;
            }
            else {
              iVar29 = (*(*(_func_int ***)local_378)[0xb])(local_378,2);
            }
            _uStack_68 = (Node *)(ulong)(iVar29 + uVar11);
          }
        }
        else {
          _uStack_68 = (Node *)(ulong)(local_378._0_4_ - 1);
        }
        lVar32 = 0;
        iVar29 = 0;
        goto LAB_00edb47c;
      }
      puVar16 = pPVar25->inputLim;
      if (puVar16 <= puVar34) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = local_40;
        *local_40 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x25d,"(!IsEOF())","!IsEOF()");
        if (!bVar8) goto LAB_00edbcd5;
        *puVar15 = 0;
        puVar16 = pPVar25->inputLim;
      }
      OVar10 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                         (&pPVar25->super_UTF8EncodingPolicyBase<false>,local_60,puVar16);
      uVar30 = (uint)(ushort)OVar10;
      if ((ushort)OVar10 < 0x100) {
        if ((ASCIIChars::classes[(ushort)OVar10] & 2) != 0) {
LAB_00edab71:
          Fail(pPVar25,-0x7ff5fc0c);
        }
      }
      else if ((OVar10 & 0xfffeU) == 0x2028) goto LAB_00edab71;
LAB_00edab88:
      bVar23 = 0;
      uVar26 = 0;
    }
LAB_00edab8d:
    pPVar25 = pPStack_48;
    if ((~(byte)uVar31 & CVar21 == 0xffffffff) == 0) {
      if ((uVar31 & 1) == 0) {
        if (uVar13 == 0xffffffff) {
          CharSet<unsigned_int>::SetRange
                    ((CharSet<unsigned_int> *)local_378,pPStack_48->ctAllocator,CVar21,CVar21);
          uVar13 = 0xffffffff;
          goto LAB_00edac98;
        }
        if (uVar30 < uVar13) {
          if (pPStack_48->unicodeFlagPresent == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = local_40;
            *local_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
            if (!bVar8) goto LAB_00edbcd5;
            *puVar15 = 0;
          }
          Fail(pPStack_48,-0x7ff5ec63);
        }
        pAVar27 = pPStack_48->ctAllocator;
        pPVar25 = pPStack_48;
      }
      else {
        if (pPStack_48->unicodeFlagPresent == true) {
          Fail(pPStack_48,-0x7ff5e9d3);
        }
        pPVar25 = pPStack_48;
        if (uVar30 != 0xffffffff) {
          CharSet<unsigned_int>::SetRange
                    ((CharSet<unsigned_int> *)local_378,pPStack_48->ctAllocator,uVar30,uVar30);
        }
        pAVar27 = pPVar25->ctAllocator;
        uVar13 = 0x2d;
        uVar30 = 0x2d;
      }
      CharSet<unsigned_int>::SetRange((CharSet<unsigned_int> *)local_378,pAVar27,uVar13,uVar30);
      uVar13 = 0xffffffff;
      uVar30 = 0xffffffff;
    }
LAB_00edac98:
    puVar34 = pPVar25->next;
    if (pPVar25->inputLim < puVar34) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = local_40;
      *local_40 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar8) goto LAB_00edbcd5;
      *puVar15 = 0;
      puVar34 = *local_60;
    }
    uVar9 = *puVar34;
    uVar24 = (undefined4)CONCAT71(uVar26,bVar23 & uVar9 == '-');
    pPVar25 = pPStack_48;
    uVar31 = uStack_68;
  } while( true );
  while( true ) {
    uVar17 = uVar17 + 1;
    lVar32 = *plVar22;
    plVar22 = plVar22 + 5;
    if (lVar32 != 1) break;
    if (uVar17 == 0xf) goto LAB_00edaeaa;
  }
  if (0xf < uVar17) {
LAB_00edaeaa:
    pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar25->ctAllocator,0x364470);
    pNVar18->tag = MatchSet;
    pNVar18->features = 0;
    *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
    pNVar18->firstSet = (CharSet<char16_t> *)0x0;
    pNVar18->followSet = (CharSet<char16_t> *)0x0;
    (pNVar18->prevConsumes).lower = 0;
    auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
    *(undefined1 (*) [16])&(pNVar18->prevConsumes).upper = auVar35;
    (pNVar18->followConsumes).upper = 0xffffffff;
    pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
    *(undefined2 *)&pNVar18[1]._vptr_Node = 0x100;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar18[1].tag);
    return pNVar18;
  }
LAB_00edaf36:
  if ((local_31 != '^') && (pPVar25->caseInsensitiveFlagPresent == false)) {
    lVar32 = 0;
    iVar29 = 0;
    do {
      ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar32);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
        if (ppuVar3 == (undefined **)0x0) {
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar32));
        }
        else {
          if ((ppuVar3 != &CharSetFull::Instance) &&
             (uVar31 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar31)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = local_40;
            *local_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar8) goto LAB_00edbcd5;
            *puVar15 = 0;
          }
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar32));
          ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar32);
          if (ppuVar3 == &CharSetFull::Instance) {
            iVar12 = 0xff00;
          }
          else {
            iVar12 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
          }
          uVar11 = iVar12 + uVar11;
        }
      }
      else {
        uVar11 = (int)ppuVar3 - 1;
      }
      puVar15 = local_40;
      pPVar25 = pPStack_48;
      iVar29 = iVar29 + uVar11;
      lVar32 = lVar32 + 0x28;
    } while (lVar32 != 0x2a8);
    if (iVar29 == 1) {
      codePointValue = CharSet<unsigned_int>::Singleton((CharSet<unsigned_int> *)local_378);
      if (codePointValue < 0x10000) {
        pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x48,pPVar25->ctAllocator,0x364470);
        pNVar18->tag = MatchChar;
        pNVar18->features = 0;
        *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
        pNVar18->firstSet = (CharSet<char16_t> *)0x0;
        pNVar18->followSet = (CharSet<char16_t> *)0x0;
        (pNVar18->prevConsumes).lower = 0;
        *(undefined8 *)&(pNVar18->prevConsumes).upper = 0xffffffff;
        *(undefined8 *)&(pNVar18->thisConsumes).upper = 0xffffffff;
        (pNVar18->followConsumes).upper = 0xffffffff;
        pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
        *(undefined1 *)&pNVar18[1].tag = Empty;
        auVar35 = pshuflw(ZEXT416(codePointValue),ZEXT416(codePointValue),0);
        pNVar18[1]._vptr_Node = (_func_int **)auVar35._0_8_;
      }
      else {
        if (pPVar25->unicodeFlagPresent == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
          if (!bVar8) goto LAB_00edbcd5;
          *puVar15 = 0;
        }
        Js::NumberUtilities::CodePointAsSurrogatePair
                  (codePointValue,(char16 *)local_930,
                   (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
        pNVar18 = CreateSurrogatePairAtom
                            (pPVar25,local_930._0_2_,
                             negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
      }
      CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_378,pPVar25->ctAllocator);
      return pNVar18;
    }
  }
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_930);
  if (pPVar25->caseInsensitiveFlagPresent == false) {
    if (local_31 == '^') {
      CharSet<unsigned_int>::ToComplement
                ((CharSet<unsigned_int> *)local_378,pPVar25->ctAllocator,
                 (CharSet<unsigned_int> *)local_930);
      CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)local_378,pPVar25->ctAllocator);
      local_80 = &negatedSet;
      local_58 = (CharSet<unsigned_int> *)local_930;
    }
  }
  else {
    puVar2 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
    CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar2);
    local_58 = (CharSet<unsigned_int> *)local_378;
    CharSet<unsigned_int>::ToEquivClass
              (local_58,pPVar25->ctAllocator,(CharSet<unsigned_int> *)puVar2);
    lVar32 = 0;
    uVar31 = 0;
    do {
      ppuVar3 = *(undefined ***)((long)&negatedSet.characterPlanes[0x10].rep + lVar32 + 0x20);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
        if (ppuVar3 == (undefined **)0x0) {
          uVar11 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar32));
        }
        else {
          if ((ppuVar3 != &CharSetFull::Instance) &&
             (uVar30 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar30)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = local_40;
            *local_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar8) goto LAB_00edbcd5;
            *puVar15 = 0;
          }
          uVar11 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar32));
          ppuVar3 = *(undefined ***)((long)&negatedSet.characterPlanes[0x10].rep + lVar32 + 0x20);
          if (ppuVar3 == &CharSetFull::Instance) {
            iVar29 = 0xff00;
          }
          else {
            iVar29 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
          }
          uVar11 = iVar29 + uVar11;
        }
      }
      else {
        uVar11 = (int)ppuVar3 - 1;
      }
      uVar31 = uVar31 + uVar11;
      lVar32 = lVar32 + 0x28;
    } while (lVar32 != 0x2a8);
    lVar32 = 0;
    uVar30 = 0;
    do {
      ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar32);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
        if (ppuVar3 == (undefined **)0x0) {
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar32));
        }
        else {
          if ((ppuVar3 != &CharSetFull::Instance) &&
             (uVar13 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar13)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = local_40;
            *local_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar8) goto LAB_00edbcd5;
            *puVar15 = 0;
          }
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar32));
          ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar32);
          if (ppuVar3 == &CharSetFull::Instance) {
            iVar29 = 0xff00;
          }
          else {
            iVar29 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
          }
          uVar11 = iVar29 + uVar11;
        }
      }
      else {
        uVar11 = (int)ppuVar3 - 1;
      }
      puVar15 = local_40;
      pPVar25 = pPStack_48;
      uVar30 = uVar30 + uVar11;
      lVar32 = lVar32 + 0x28;
    } while (lVar32 != 0x2a8);
    if (uVar31 < uVar30) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                         "caseEquivalent.Count() >= codePointSet.Count()");
      if (!bVar8) goto LAB_00edbcd5;
      *puVar15 = 0;
    }
    if (local_31 == '^') {
      CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_378,pPVar25->ctAllocator);
      puVar2 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
      CharSet<unsigned_int>::ToComplement
                ((CharSet<unsigned_int> *)puVar2,pPVar25->ctAllocator,
                 (CharSet<unsigned_int> *)local_378);
      CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)puVar2,pPVar25->ctAllocator);
    }
    else {
      CharSet<unsigned_int>::CloneFrom
                ((CharSet<unsigned_int> *)local_378,pPVar25->ctAllocator,
                 (CharSet<unsigned_int> *)(negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6)
                );
    }
  }
  pCVar28 = local_58;
  lVar32 = 0;
  uVar11 = 0;
  do {
    ppuVar3 = *(undefined ***)((long)&local_58->characterPlanes[0].rep + lVar32);
    if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
      if (ppuVar3 == (undefined **)0x0) {
        uVar14 = CharBitvec::Count((CharBitvec *)
                                   ((long)&pCVar28->characterPlanes[0].rep + lVar32 + 8));
      }
      else {
        if ((ppuVar3 != &CharSetFull::Instance) &&
           (uVar31 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar31)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = local_40;
          *local_40 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar8) goto LAB_00edbcd5;
          *puVar15 = 0;
        }
        uVar14 = CharBitvec::Count((CharBitvec *)
                                   ((long)&pCVar28->characterPlanes[0].rep + lVar32 + 8));
        ppuVar3 = *(undefined ***)((long)&local_58->characterPlanes[0].rep + lVar32);
        if (ppuVar3 == &CharSetFull::Instance) {
          iVar29 = 0xff00;
        }
        else {
          iVar29 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
        }
        uVar14 = iVar29 + uVar14;
      }
    }
    else {
      uVar14 = (int)ppuVar3 - 1;
    }
    puVar15 = local_40;
    uVar11 = uVar11 + uVar14;
    lVar32 = lVar32 + 0x28;
  } while (lVar32 != 0x2a8);
  pCVar4 = local_58->characterPlanes[0].rep.full.root;
  if (&DAT_00000004 < (undefined1 *)((long)&pCVar4[-1]._vptr_CharSetNode + 7)) {
    if (pCVar4 == (CharSetNode *)0x0) {
      uVar14 = CharBitvec::Count((CharBitvec *)local_80);
    }
    else {
      if ((pCVar4 != (CharSetNode *)&CharSetFull::Instance) &&
         (uVar31 = (*pCVar4->_vptr_CharSetNode[0xb])(pCVar4,2), 0xff00 < uVar31)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x252,
                           "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                           ,
                           "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                          );
        if (!bVar8) goto LAB_00edbcd5;
        *puVar15 = 0;
      }
      uVar14 = CharBitvec::Count((CharBitvec *)local_80);
      pCVar4 = local_58->characterPlanes[0].rep.full.root;
      if (pCVar4 == (CharSetNode *)&CharSetFull::Instance) {
        iVar29 = 0xff00;
      }
      else {
        iVar29 = (*pCVar4->_vptr_CharSetNode[0xb])(pCVar4,2);
      }
      uVar14 = iVar29 + uVar14;
      puVar15 = local_40;
    }
  }
  else {
    uVar14 = (int)pCVar4 - 1;
  }
  pPVar25 = pPStack_48;
  if (uVar11 != uVar14) {
    if (uVar14 == 0) {
      _uStack_68 = (Node *)0x0;
      pNVar18 = (Node *)0x0;
    }
    else {
      negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_ = 0xffff;
      local_6c = local_6c & 0xffff0000;
      bVar8 = CharSet<char16_t>::GetNextRange
                        (local_58->characterPlanes,L'\xd800',
                         (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                         (Char *)&local_6c);
      pPVar25 = pPStack_48;
      uVar7 = negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_;
      pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,pPStack_48->ctAllocator,0x364470);
      pNVar18->tag = MatchSet;
      pNVar18->features = 0;
      *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
      pNVar18->firstSet = (CharSet<char16_t> *)0x0;
      pNVar18->followSet = (CharSet<char16_t> *)0x0;
      (pNVar18->prevConsumes).lower = 0;
      auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
      *(undefined1 (*) [16])&(pNVar18->prevConsumes).upper = auVar35;
      (pNVar18->followConsumes).upper = 0xffffffff;
      pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
      *(undefined2 *)&pNVar18[1]._vptr_Node = 0x100;
      pNVar33 = &pNVar18[1].tag;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar33);
      pCVar28 = local_58;
      if ((bVar8) && ((ushort)uVar7 < 0xe000)) {
        CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                  (local_58,pPVar25->ctAllocator,(CharSet<char16_t> *)pNVar33);
        pPVar25 = pPStack_48;
        _uStack_68 = (Node *)new<Memory::ArenaAllocator>(0x68,pPStack_48->ctAllocator,0x364470);
        _uStack_68->tag = MatchSet;
        _uStack_68->features = 0;
        *(uint *)&_uStack_68->field_0xc = *(uint *)&_uStack_68->field_0xc & 0xffff8000;
        _uStack_68->firstSet = (CharSet<char16_t> *)0x0;
        _uStack_68->followSet = (CharSet<char16_t> *)0x0;
        (_uStack_68->prevConsumes).lower = 0;
        auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
        *(undefined1 (*) [16])&(_uStack_68->prevConsumes).upper = auVar35;
        (_uStack_68->followConsumes).upper = 0xffffffff;
        _uStack_68->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
        *(undefined2 *)&_uStack_68[1]._vptr_Node = 0x100;
        pNVar6 = _uStack_68 + 1;
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar6->tag);
        CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
                  (pCVar28,pPVar25->ctAllocator,(CharSet<char16_t> *)&pNVar6->tag);
        puVar15 = local_40;
      }
      else {
        CharSet<unsigned_int>::CloneSimpleCharsTo
                  (local_58,pPVar25->ctAllocator,(CharSet<char16_t> *)pNVar33);
        _uStack_68 = (Node *)0x0;
        pPVar25 = pPStack_48;
        puVar15 = local_40;
      }
    }
    if (pPVar25->unicodeFlagPresent == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
      if (!bVar8) goto LAB_00edbcd5;
      *puVar15 = 0;
    }
    if (pNVar18 == (Node *)0x0) {
      pAVar19 = (AltNode *)0x0;
    }
    else {
      pAVar19 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPStack_48->ctAllocator,0x364470);
      (pAVar19->super_Node).tag = Alt;
      (pAVar19->super_Node).features = 0;
      puVar1 = &(pAVar19->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pAVar19->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pAVar19->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pAVar19->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pAVar19->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pAVar19->super_Node).thisConsumes.upper = 0xffffffff;
      (pAVar19->super_Node).followConsumes.upper = 0xffffffff;
      (pAVar19->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
      pAVar19->head = pNVar18;
      pAVar19->switchSize = 0;
      pAVar19->tail = (AltNode *)0x0;
      pAVar19->runtimeTrie = (RuntimeCharTrie *)0x0;
      *(undefined8 *)((long)&pAVar19->runtimeTrie + 5) = 0;
    }
    negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
    local_6c = 0;
    bVar8 = CharSet<unsigned_int>::GetNextRange
                      (local_58,0x10000,
                       (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),&local_6c)
    ;
    pPVar25 = pPStack_48;
    lastAltNode = pAVar19;
    if (bVar8) {
      do {
        if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == local_6c) {
          pAVar20 = AppendSurrogatePairToDisjunction
                              (pPVar25,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               lastAltNode);
        }
        else {
          pAVar20 = AppendSurrogateRangeToDisjunction
                              (pPVar25,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               local_6c,lastAltNode);
        }
        if (pAVar19 == (AltNode *)0x0) {
          pAVar19 = pAVar20;
        }
        if (pAVar20 == (AltNode *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = local_40;
          *local_40 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
          if (!bVar8) goto LAB_00edbcd5;
          *puVar15 = 0;
        }
        do {
          lastAltNode = pAVar20;
          pAVar20 = lastAltNode->tail;
        } while (lastAltNode->tail != (AltNode *)0x0);
        bVar8 = CharSet<unsigned_int>::GetNextRange
                          (local_58,local_6c + 1,
                           (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                           &local_6c);
      } while (bVar8);
    }
    pNVar18 = _uStack_68;
    if (_uStack_68 != (Node *)0x0) {
      pAVar20 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar25->ctAllocator,0x364470);
      (pAVar20->super_Node).tag = Alt;
      (pAVar20->super_Node).features = 0;
      puVar1 = &(pAVar20->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pAVar20->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pAVar20->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pAVar20->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pAVar20->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pAVar20->super_Node).thisConsumes.upper = 0xffffffff;
      (pAVar20->super_Node).followConsumes.upper = 0xffffffff;
      (pAVar20->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
      pAVar20->head = pNVar18;
      pAVar20->switchSize = 0;
      pAVar20->tail = (AltNode *)0x0;
      pAVar20->runtimeTrie = (RuntimeCharTrie *)0x0;
      *(undefined8 *)((long)&pAVar20->runtimeTrie + 5) = 0;
      lastAltNode->tail = pAVar20;
      pPVar25 = pPStack_48;
    }
    CharSet<unsigned_int>::Clear(local_58,pPVar25->ctAllocator);
    if (pAVar19 != (AltNode *)0x0) {
      if (pAVar19->tail != (AltNode *)0x0) {
        return &pAVar19->super_Node;
      }
      return pAVar19->head;
    }
    return (Node *)0x0;
  }
  pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,pPStack_48->ctAllocator,0x364470);
  *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
  pNVar18->tag = MatchSet;
  pNVar18->features = 0;
  pNVar18->firstSet = (CharSet<char16_t> *)0x0;
  pNVar18->followSet = (CharSet<char16_t> *)0x0;
  (pNVar18->prevConsumes).lower = 0;
  auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
  *(undefined1 (*) [16])&(pNVar18->prevConsumes).upper = auVar35;
  (pNVar18->followConsumes).upper = 0xffffffff;
  pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
  *(bool *)&pNVar18[1]._vptr_Node = local_31 == '^';
  *(undefined1 *)((long)&pNVar18[1]._vptr_Node + 1) = 1;
  pNVar33 = &pNVar18[1].tag;
  CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar33);
  pAVar27 = pPVar25->ctAllocator;
  pCVar28 = local_58;
  goto LAB_00edb61a;
LAB_00edb47c:
  do {
    ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar32);
    if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
      if (ppuVar3 == (undefined **)0x0) {
        uVar11 = CharBitvec::Count((CharBitvec *)
                                   ((long)&codePointSet.characterPlanes[0].rep + lVar32));
      }
      else {
        if ((ppuVar3 != &CharSetFull::Instance) &&
           (uVar31 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar31)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = local_40;
          *local_40 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar8) goto LAB_00edbcd5;
          *puVar15 = 0;
        }
        uVar11 = CharBitvec::Count((CharBitvec *)
                                   ((long)&codePointSet.characterPlanes[0].rep + lVar32));
        ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar32);
        if (ppuVar3 == &CharSetFull::Instance) {
          iVar12 = 0xff00;
        }
        else {
          iVar12 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
        }
        uVar11 = iVar12 + uVar11;
      }
    }
    else {
      uVar11 = (int)ppuVar3 - 1;
    }
    pPVar25 = pPStack_48;
    iVar29 = iVar29 + uVar11;
    lVar32 = lVar32 + 0x28;
  } while (lVar32 != 0x2a8);
  if (uStack_68 != iVar29) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = local_40;
    *local_40 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                       "codePointSet.SimpleCharCount() == codePointSet.Count()");
    if (!bVar8) goto LAB_00edbcd5;
    *puVar15 = 0;
  }
  pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar25->ctAllocator,0x364470);
  *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
  pNVar18->tag = MatchSet;
  pNVar18->features = 0;
  pNVar18->firstSet = (CharSet<char16_t> *)0x0;
  pNVar18->followSet = (CharSet<char16_t> *)0x0;
  (pNVar18->prevConsumes).lower = 0;
  auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
  *(undefined1 (*) [16])&(pNVar18->prevConsumes).upper = auVar35;
  (pNVar18->followConsumes).upper = 0xffffffff;
  pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
  *(bool *)&pNVar18[1]._vptr_Node = local_31 == '^';
  *(undefined1 *)((long)&pNVar18[1]._vptr_Node + 1) = 1;
  pNVar33 = &pNVar18[1].tag;
  CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar33);
  pAVar27 = pPVar25->ctAllocator;
  pCVar28 = (CharSet<unsigned_int> *)local_378;
LAB_00edb61a:
  CharSet<unsigned_int>::CloneSimpleCharsTo(pCVar28,pAVar27,(CharSet<char16_t> *)pNVar33);
  return pNVar18;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }